

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_method(FuncState *fs,ExpDesc *e,ExpDesc *key)

{
  BCReg n;
  BCReg BVar1;
  undefined8 in_RDX;
  FuncState *in_RSI;
  long in_RDI;
  BCReg obj;
  BCReg func;
  BCReg idx;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  BCIns ins;
  
  ins = (BCIns)((ulong)in_RDX >> 0x20);
  n = expr_toanyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (ExpDesc *)0x12ca82);
  expr_free((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            (ExpDesc *)CONCAT44(n,in_stack_ffffffffffffffd8));
  uVar2 = *(undefined4 *)(in_RDI + 0x34);
  bcemit_INS(in_RSI,ins);
  BVar1 = const_str((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),
                    (ExpDesc *)CONCAT44(n,in_stack_ffffffffffffffd8));
  if (BVar1 < 0x100) {
    bcreg_reserve((FuncState *)CONCAT44(BVar1,uVar2),n);
    bcemit_INS(in_RSI,ins);
  }
  else {
    bcreg_reserve((FuncState *)CONCAT44(BVar1,uVar2),n);
    bcemit_INS(in_RSI,ins);
    bcemit_INS(in_RSI,ins);
    *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + -1;
  }
  *(undefined4 *)&in_RSI->kt = uVar2;
  *(undefined4 *)&in_RSI->ls = 0xc;
  return;
}

Assistant:

static void bcemit_method(FuncState *fs, ExpDesc *e, ExpDesc *key)
{
  BCReg idx, func, obj = expr_toanyreg(fs, e);
  expr_free(fs, e);
  func = fs->freereg;
  bcemit_AD(fs, BC_MOV, func+1, obj);  /* Copy object to first argument. */
  lua_assert(expr_isstrk(key));
  idx = const_str(fs, key);
  if (idx <= BCMAX_C) {
    bcreg_reserve(fs, 2);
    bcemit_ABC(fs, BC_TGETS, func, obj, idx);
  } else {
    bcreg_reserve(fs, 3);
    bcemit_AD(fs, BC_KSTR, func+2, idx);
    bcemit_ABC(fs, BC_TGETV, func, obj, func+2);
    fs->freereg--;
  }
  e->u.s.info = func;
  e->k = VNONRELOC;
}